

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFrontFacingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlFrontFacingCaseInstance *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TestContext *pTVar4;
  TestLog *pTVar5;
  ProgramCollection<vk::ProgramBinary> *pPVar6;
  ProgramBinary *pPVar7;
  TextureFormat *pTVar8;
  void *pvVar9;
  char *pcVar10;
  VkPrimitiveTopology topology;
  allocator<char> local_8c1;
  string local_8c0;
  undefined4 local_8a0;
  allocator<char> local_899;
  string local_898;
  Vector<int,_3> local_874;
  Vector<unsigned_int,_4> local_868;
  ConstPixelBufferAccess local_858;
  ConstPixelBufferAccess local_830;
  ConstPixelBufferAccess local_808;
  ConstPixelBufferAccess local_7e0;
  ConstPixelBufferAccess local_7b8;
  ConstPixelBufferAccess local_790;
  TextureFormat local_768;
  ConstPixelBufferAccess local_760;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  LogImage local_6e8;
  ConstPixelBufferAccess local_658;
  ConstPixelBufferAccess local_630;
  ConstPixelBufferAccess local_608;
  ConstPixelBufferAccess local_5e0;
  TextureFormat local_5b8;
  ConstPixelBufferAccess local_5b0;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  LogImage local_538;
  undefined1 local_4a8 [8];
  ReferenceDrawContext refDrawContext;
  VulkanDrawContext dc;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  DrawState drawState;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  Shader local_198;
  allocator<char> local_181;
  string local_180;
  Shader local_160;
  Vector<float,_4> local_150;
  Vector<float,_4> local_140;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  Vector<float,_4> local_100;
  string local_f0 [8];
  string testDesc;
  FrontFacingFragmentShader fragmentShader;
  undefined1 local_88 [8];
  FrontFacingVertexShader vertexShader;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  TestLog *log;
  BuiltinGlFrontFacingCaseInstance *this_local;
  
  pTVar4 = Context::getTestContext
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  FrontFacingVertexShader::FrontFacingVertexShader((FrontFacingVertexShader *)local_88);
  FrontFacingFragmentShader::FrontFacingFragmentShader
            ((FrontFacingFragmentShader *)((long)&testDesc.field_2 + 8));
  std::__cxx11::string::string(local_f0);
  tcu::Vector<float,_4>::Vector(&local_100,-0.75,-0.75,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_100);
  tcu::Vector<float,_4>::Vector(&local_110,0.0,-0.75,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_110);
  tcu::Vector<float,_4>::Vector(&local_120,-0.37,0.75,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_120);
  tcu::Vector<float,_4>::Vector(&local_130,0.37,0.75,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_130);
  tcu::Vector<float,_4>::Vector(&local_140,0.75,-0.75,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_140);
  tcu::Vector<float,_4>::Vector(&local_150,0.0,-0.75,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_150);
  pPVar6 = Context::getBinaryCollection
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"vert",&local_181);
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,&local_180);
  drawutil::Shader::Shader(&local_160,VK_SHADER_STAGE_VERTEX_BIT,pPVar7);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pPVar6 = Context::getBinaryCollection
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"frag",&local_1b9);
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,&local_1b8);
  drawutil::Shader::Shader(&local_198,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar7);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  drawutil::getPrimitiveTopologyShortName_abi_cxx11_
            ((string *)&drawState.lineWidth,(drawutil *)(ulong)this->m_topology,topology);
  std::operator+(&local_200,"gl_FrontFacing ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &drawState.lineWidth);
  std::operator+(&local_1e0,&local_200," ");
  std::__cxx11::string::operator=(local_f0,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&drawState.lineWidth);
  drawutil::DrawState::DrawState
            ((DrawState *)((long)&drawCallData.vertices + 4),this->m_topology,0x10,0x10);
  drawutil::DrawCallData::DrawCallData
            ((DrawCallData *)&vulkanProgram,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  drawutil::VulkanProgram::VulkanProgram
            ((VulkanProgram *)
             &dc.m_vertexBuffer.
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
              m_data.field_0x8,
             (vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  drawutil::VulkanDrawContext::VulkanDrawContext
            ((VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap,
             (this->super_ShaderRenderCaseInstance).super_TestInstance.m_context,
             (DrawState *)((long)&drawCallData.vertices + 4),(DrawCallData *)&vulkanProgram,
             (VulkanProgram *)
             &dc.m_vertexBuffer.
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
              m_data.field_0x8);
  drawutil::VulkanDrawContext::draw((VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap);
  drawutil::ReferenceDrawContext::ReferenceDrawContext
            ((ReferenceDrawContext *)local_4a8,(DrawState *)((long)&drawCallData.vertices + 4),
             (DrawCallData *)&vulkanProgram,(VertexShader *)local_88,
             (FragmentShader *)((long)&testDesc.field_2 + 8));
  drawutil::ReferenceDrawContext::draw((ReferenceDrawContext *)local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"reference",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"reference",&local_581);
  drawutil::ReferenceDrawContext::getColorPixels(&local_5e0,(ReferenceDrawContext *)local_4a8);
  pTVar8 = tcu::ConstPixelBufferAccess::getFormat(&local_5e0);
  local_5b8 = *pTVar8;
  drawutil::ReferenceDrawContext::getColorPixels(&local_608,(ReferenceDrawContext *)local_4a8);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&local_608);
  drawutil::ReferenceDrawContext::getColorPixels(&local_630,(ReferenceDrawContext *)local_4a8);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(&local_630);
  drawutil::ReferenceDrawContext::getColorPixels(&local_658,(ReferenceDrawContext *)local_4a8);
  pvVar9 = tcu::ConstPixelBufferAccess::getDataPtr(&local_658);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_5b0,&local_5b8,iVar2,iVar3,1,pvVar9);
  tcu::LogImage::LogImage
            (&local_538,&local_558,&local_580,&local_5b0,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_538);
  tcu::LogImage::~LogImage(&local_538);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"result",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"result",&local_731);
  drawutil::VulkanDrawContext::getColorPixels
            (&local_790,(VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap);
  pTVar8 = tcu::ConstPixelBufferAccess::getFormat(&local_790);
  local_768 = *pTVar8;
  drawutil::VulkanDrawContext::getColorPixels
            (&local_7b8,(VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&local_7b8);
  drawutil::VulkanDrawContext::getColorPixels
            (&local_7e0,(VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(&local_7e0);
  drawutil::VulkanDrawContext::getColorPixels
            (&local_808,(VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap);
  pvVar9 = tcu::ConstPixelBufferAccess::getDataPtr(&local_808);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_760,&local_768,iVar2,iVar3,1,pvVar9);
  tcu::LogImage::LogImage
            (&local_6e8,&local_708,&local_730,&local_760,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_6e8);
  tcu::LogImage::~LogImage(&local_6e8);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  pTVar4 = Context::getTestContext
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  drawutil::ReferenceDrawContext::getColorPixels(&local_830,(ReferenceDrawContext *)local_4a8);
  drawutil::VulkanDrawContext::getColorPixels
            (&local_858,(VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap);
  tcu::Vector<unsigned_int,_4>::Vector(&local_868,0);
  tcu::Vector<int,_3>::Vector(&local_874,1,1,0);
  bVar1 = tcu::intThresholdPositionDeviationCompare
                    (pTVar5,"ComparisonResult","Image comparison result",&local_830,&local_858,
                     &local_868,&local_874,false,COMPARE_LOG_RESULT);
  if (bVar1) {
    std::__cxx11::string::operator+=(local_f0,"passed");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,pcVar10,&local_899);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_898);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator(&local_899);
  }
  else {
    std::__cxx11::string::operator+=(local_f0,"failed");
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,pcVar10,&local_8c1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_8c0);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
  }
  local_8a0 = 1;
  drawutil::ReferenceDrawContext::~ReferenceDrawContext((ReferenceDrawContext *)local_4a8);
  drawutil::VulkanDrawContext::~VulkanDrawContext
            ((VulkanDrawContext *)&refDrawContext.m_refImage.m_data.m_cap);
  std::__cxx11::string::~string(local_f0);
  FrontFacingFragmentShader::~FrontFacingFragmentShader
            ((FrontFacingFragmentShader *)((long)&testDesc.field_2 + 8));
  FrontFacingVertexShader::~FrontFacingVertexShader((FrontFacingVertexShader *)local_88);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinGlFrontFacingCaseInstance::iterate (void)
{
	TestLog&					log				= m_context.getTestContext().getLog();
	std::vector<Vec4>			vertices;
	std::vector<Shader>			shaders;
	FrontFacingVertexShader		vertexShader;
	FrontFacingFragmentShader	fragmentShader;
	std::string					testDesc;

	vertices.push_back(Vec4( -0.75f,	-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.0f,		-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4( -0.37f,	0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.37f,	0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.75f,	-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.0f,		-0.75f,	0.0f,	1.0f));

	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT, m_context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("frag")));

	testDesc = "gl_FrontFacing " + getPrimitiveTopologyShortName(m_topology) + " ";

	DrawState					drawState		(m_topology, FRONTFACE_RENDERWIDTH, FRONTFACE_RENDERHEIGHT);
	DrawCallData				drawCallData	(vertices);
	VulkanProgram				vulkanProgram	(shaders);

	VulkanDrawContext			dc(m_context, drawState, drawCallData, vulkanProgram);
	dc.draw();

	ReferenceDrawContext		refDrawContext(drawState, drawCallData, vertexShader, fragmentShader);
	refDrawContext.draw();

	log << TestLog::Image( "reference",
							"reference",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									refDrawContext.getColorPixels().getFormat()),
									refDrawContext.getColorPixels().getWidth(),
									refDrawContext.getColorPixels().getHeight(),
									1,
									refDrawContext.getColorPixels().getDataPtr()));

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									dc.getColorPixels().getFormat()),
									dc.getColorPixels().getWidth(),
									dc.getColorPixels().getHeight(),
									1,
									dc.getColorPixels().getDataPtr()));

	if (tcu::intThresholdPositionDeviationCompare(m_context.getTestContext().getLog(),
												  "ComparisonResult",
												  "Image comparison result",
												  refDrawContext.getColorPixels(),
												  dc.getColorPixels(),
												  UVec4(0u),
												  IVec3(1,1,0),
												  false,
												  tcu::COMPARE_LOG_RESULT))
	{
		testDesc += "passed";
		return tcu::TestStatus::pass(testDesc.c_str());
	}
	else
	{
		testDesc += "failed";
		return tcu::TestStatus::fail(testDesc.c_str());
	}
}